

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

void __thiscall MapLoader::~MapLoader(MapLoader *this)

{
  ~MapLoader(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

MapLoader::~MapLoader() {
    delete pMapFile;
}